

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O0

unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
duckdb::ArrowType::CreateListType
          (DBConfig *config,ArrowSchema *child,ArrowVariableSizeType size_type,bool view)

{
  ArrowType *in_RDI;
  byte in_R8B;
  LogicalType type;
  unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true> type_info;
  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> child_type;
  bool in_stack_00000197;
  ArrowType *in_stack_00000198;
  unique_ptr<duckdb::ArrowListInfo,_std::default_delete<duckdb::ArrowListInfo>_>
  *in_stack_ffffffffffffff28;
  _Head_base<0UL,_duckdb::ArrowType_*,_false> other;
  shared_ptr<duckdb::ArrowType,_true> *this;
  undefined7 in_stack_ffffffffffffff60;
  ArrowVariableSizeType in_stack_ffffffffffffff67;
  DBConfig *in_stack_ffffffffffffff68;
  ArrowVariableSizeType in_stack_ffffffffffffff77;
  LogicalType *in_stack_ffffffffffffff78;
  unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>
  *in_stack_ffffffffffffff80;
  LogicalType *in_stack_ffffffffffffff88;
  shared_ptr<duckdb::ArrowType,_true> local_28 [2];
  
  local_28[0].internal.super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi._6_1_ = in_R8B & 1;
  this = local_28;
  other._M_head_impl = in_RDI;
  GetArrowLogicalType(in_stack_ffffffffffffff68,
                      (ArrowSchema *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::unique_ptr
            ((unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true> *)
             0x1a2703e);
  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::operator->
            ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *)in_RDI);
  GetDuckType(in_stack_00000198,in_stack_00000197);
  LogicalType::LIST(in_stack_ffffffffffffff78);
  LogicalType::~LogicalType((LogicalType *)0x1a27080);
  if ((local_28[0].internal.super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._6_1_ & 1) == 0) {
    shared_ptr<duckdb::ArrowType,_true>::
    shared_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true,_0>
              (this,(unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *)
                    other._M_head_impl);
    ArrowListInfo::List((shared_ptr<duckdb::ArrowType,_true> *)in_stack_ffffffffffffff68,
                        in_stack_ffffffffffffff67);
    unique_ptr<duckdb::ArrowTypeInfo,std::default_delete<duckdb::ArrowTypeInfo>,true>::
    unique_ptr<duckdb::ArrowListInfo,std::default_delete<std::unique_ptr<duckdb::ArrowTypeInfo,std::default_delete<duckdb::ArrowTypeInfo>>>,void>
              ((unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>
                *)in_RDI,in_stack_ffffffffffffff28);
    unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::operator=
              ((unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>
                *)in_RDI,
               (unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>
                *)in_stack_ffffffffffffff28);
    unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::~unique_ptr
              ((unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>
                *)0x1a271b7);
    unique_ptr<duckdb::ArrowListInfo,_std::default_delete<duckdb::ArrowListInfo>,_true>::~unique_ptr
              ((unique_ptr<duckdb::ArrowListInfo,_std::default_delete<duckdb::ArrowListInfo>,_true>
                *)0x1a271c1);
    shared_ptr<duckdb::ArrowType,_true>::~shared_ptr
              ((shared_ptr<duckdb::ArrowType,_true> *)0x1a271cb);
  }
  else {
    shared_ptr<duckdb::ArrowType,_true>::
    shared_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true,_0>
              (this,(unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *)
                    other._M_head_impl);
    ArrowListInfo::ListView
              ((shared_ptr<duckdb::ArrowType,_true> *)in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff77);
    unique_ptr<duckdb::ArrowTypeInfo,std::default_delete<duckdb::ArrowTypeInfo>,true>::
    unique_ptr<duckdb::ArrowListInfo,std::default_delete<std::unique_ptr<duckdb::ArrowTypeInfo,std::default_delete<duckdb::ArrowTypeInfo>>>,void>
              ((unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>
                *)in_RDI,in_stack_ffffffffffffff28);
    unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::operator=
              ((unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>
                *)in_RDI,
               (unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>
                *)in_stack_ffffffffffffff28);
    unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::~unique_ptr
              ((unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>
                *)0x1a270e6);
    unique_ptr<duckdb::ArrowListInfo,_std::default_delete<duckdb::ArrowListInfo>,_true>::~unique_ptr
              ((unique_ptr<duckdb::ArrowListInfo,_std::default_delete<duckdb::ArrowListInfo>,_true>
                *)0x1a270f0);
    shared_ptr<duckdb::ArrowType,_true>::~shared_ptr
              ((shared_ptr<duckdb::ArrowType,_true> *)0x1a270fa);
  }
  make_uniq<duckdb::ArrowType,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::ArrowTypeInfo,std::default_delete<duckdb::ArrowTypeInfo>,true>>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  LogicalType::~LogicalType((LogicalType *)0x1a27210);
  unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true> *)
             0x1a2721d);
  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *)
             0x1a2722a);
  return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         (_Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>)
         other._M_head_impl;
}

Assistant:

unique_ptr<ArrowType> ArrowType::CreateListType(DBConfig &config, ArrowSchema &child, ArrowVariableSizeType size_type,
                                                bool view) {
	auto child_type = GetArrowLogicalType(config, child);

	unique_ptr<ArrowTypeInfo> type_info;
	auto type = LogicalType::LIST(child_type->GetDuckType());
	if (view) {
		type_info = ArrowListInfo::ListView(std::move(child_type), size_type);
	} else {
		type_info = ArrowListInfo::List(std::move(child_type), size_type);
	}
	return make_uniq<ArrowType>(type, std::move(type_info));
}